

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall
soul::HEARTGenerator::HEARTGenerator
          (HEARTGenerator *this,ModuleBase *source,Module *targetModule,uint32_t maxDepth)

{
  Module *pMVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  undefined4 extraout_var;
  Function *pFVar5;
  Function *o;
  undefined4 extraout_var_00;
  pool_ref *this_01;
  VariableDeclaration *pVVar6;
  IdentifierPath *path_00;
  pool_ref<soul::AST::VariableDeclaration> *v;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *vars;
  string local_188;
  Function *local_168;
  Function *af;
  Identifier name;
  pool_ref<soul::AST::Function> *f;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *__range3;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *fns;
  string local_d8;
  string local_b8;
  Identifier local_98;
  undefined1 local_90 [8];
  IdentifierPath path;
  uint32_t maxDepth_local;
  Module *targetModule_local;
  ModuleBase *source_local;
  HEARTGenerator *this_local;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *this_00;
  
  ASTVisitor::ASTVisitor(&this->super_ASTVisitor);
  (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)&PTR__HEARTGenerator_00640970;
  pool_ptr<const_soul::AST::Graph>::pool_ptr(&this->sourceGraph);
  pool_ptr<const_soul::AST::Processor>::pool_ptr(&this->sourceProcessor);
  this->module = targetModule;
  this->loopIndex = 0;
  this->ifIndex = 0;
  this->parsingStateVariables = false;
  FunctionBuilder::FunctionBuilder(&this->builder,targetModule);
  pool_ptr<soul::heart::Variable>::pool_ptr(&this->currentTargetVariable);
  this->expressionDepth = 0;
  this->maxExpressionDepth = maxDepth;
  pool_ptr<soul::heart::Block>::pool_ptr(&this->breakTarget);
  pool_ptr<soul::heart::Block>::pool_ptr(&this->continueTarget);
  (*(source->super_ASTObject)._vptr_ASTObject[0xd])(local_90);
  local_98 = IdentifierPath::getLastPart((IdentifierPath *)local_90);
  psVar4 = Identifier::toString_abi_cxx11_(&local_98);
  std::__cxx11::string::operator=((string *)&this->module->shortName,(string *)psVar4);
  IdentifierPath::toString_abi_cxx11_(&local_b8,(IdentifierPath *)local_90);
  std::__cxx11::string::operator=((string *)&this->module->fullName,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  IdentifierPath::IdentifierPath((IdentifierPath *)&fns,(IdentifierPath *)local_90);
  getOriginalModulePath_abi_cxx11_(&local_d8,(HEARTGenerator *)&fns,path_00);
  std::__cxx11::string::operator=((string *)&this->module->originalFullName,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  IdentifierPath::~IdentifierPath((IdentifierPath *)&fns);
  iVar3 = (*(source->super_ASTObject)._vptr_ASTObject[0xc])();
  this_00 = (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             *)CONCAT44(extraout_var,iVar3);
  if (this_00 !=
      (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
       *)0x0) {
    __end3 = std::
             vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ::begin(this_00);
    f = (pool_ref<soul::AST::Function> *)
        std::
        vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
        ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                                       *)&f), bVar2) {
      name.name = (string *)
                  __gnu_cxx::
                  __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                  ::operator*(&__end3);
      pFVar5 = pool_ref<soul::AST::Function>::operator->((pool_ref<soul::AST::Function> *)name.name)
      ;
      bVar2 = AST::Function::isGeneric(pFVar5);
      if (!bVar2) {
        pFVar5 = pool_ref::operator_cast_to_Function_((pool_ref *)name.name);
        af = (Function *)getFunctionName(this,pFVar5);
        pMVar1 = this->module;
        psVar4 = Identifier::operator_cast_to_string_((Identifier *)&af);
        std::__cxx11::string::string((string *)&local_188,(string *)psVar4);
        o = Module::Functions::add(&pMVar1->functions,&local_188,false);
        std::__cxx11::string::~string((string *)&local_188);
        local_168 = o;
        pool_ptr<soul::heart::Function>::pool_ptr<soul::heart::Function,void>
                  ((pool_ptr<soul::heart::Function> *)&vars,o);
        pFVar5 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)name.name);
        (pFVar5->generatedFunction).object = (Function *)vars;
        pool_ptr<soul::heart::Function>::~pool_ptr((pool_ptr<soul::heart::Function> *)&vars);
      }
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
      ::operator++(&__end3);
    }
  }
  iVar3 = (*(source->super_ASTObject)._vptr_ASTObject[0xb])();
  __end2 = std::
           vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ::begin((vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                    *)CONCAT44(extraout_var_00,iVar3));
  v = (pool_ref<soul::AST::VariableDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ::end((vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             *)CONCAT44(extraout_var_00,iVar3));
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                                     *)&v), bVar2) {
    this_01 = (pool_ref *)
              __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
              ::operator*(&__end2);
    pVVar6 = pool_ref<soul::AST::VariableDeclaration>::operator->
                       ((pool_ref<soul::AST::VariableDeclaration> *)this_01);
    if ((pVVar6->isExternal & 1U) != 0) {
      pVVar6 = pool_ref::operator_cast_to_VariableDeclaration_(this_01);
      addExternalVariable(this,pVVar6);
    }
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  IdentifierPath::~IdentifierPath((IdentifierPath *)local_90);
  return;
}

Assistant:

HEARTGenerator (AST::ModuleBase& source, Module& targetModule, uint32_t maxDepth)
        : module (targetModule), builder (targetModule), maxExpressionDepth (maxDepth)
    {
        auto path = source.getFullyQualifiedPath();
        module.shortName = path.getLastPart().toString();
        module.fullName = path.toString();
        module.originalFullName = getOriginalModulePath (path);

        if (auto fns = source.getFunctionList())
        {
            for (auto& f : *fns)
            {
                if (! f->isGeneric())
                {
                    auto name = getFunctionName (f);
                    auto& af = module.functions.add (name, false);
                    f->generatedFunction = af;
                }
            }
        }

        auto& vars = source.getStateVariableList();

        for (auto& v : vars)
            if (v->isExternal)
                addExternalVariable (v);
    }